

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O3

void resize(ATimeUs timestamp,uint old_w,uint old_h)

{
  g.target.viewport.x = 0;
  g.target.viewport.y = 0;
  g.target.viewport.w = a_app_state->width;
  g.target.viewport.h = a_app_state->height;
  g.target.framebuffer = (AGLFramebuffer *)0x0;
  return;
}

Assistant:

static void resize(ATimeUs timestamp, unsigned int old_w, unsigned int old_h) {
	(void)(timestamp);
	(void)(old_w);
	(void)(old_h);
	g.target.viewport.x = g.target.viewport.y = 0;
	g.target.viewport.w = a_app_state->width;
	g.target.viewport.h = a_app_state->height;

	g.target.framebuffer = 0;
}